

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

void __thiscall Map<String,_int>::~Map(Map<String,_int> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *next;
  ItemBlock *i_1;
  Item *end;
  Item *i;
  Map<String,_int> *this_local;
  
  for (end = (this->_begin).item; end != &this->endItem; end = end->next) {
    Item::~Item(end);
  }
  pIVar1 = this->blocks;
  while (next = pIVar1, next != (ItemBlock *)0x0) {
    pIVar1 = next->next;
    if (next != (ItemBlock *)0x0) {
      operator_delete__(next);
    }
  }
  Item::~Item(&this->endItem);
  return;
}

Assistant:

~Map()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }